

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ShapeFunctionsDerivativeZ
          (ChElementHexaANCF_3813_9 *this,ShapeVector *Nz,double x,double y,double z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  
  dVar1 = (this->m_dimensions).m_data[2];
  dVar8 = 0.25 / dVar1;
  dVar2 = (1.0 - x) * dVar8;
  dVar3 = (1.0 - y) * dVar2;
  dVar8 = (x + 1.0) * dVar8;
  dVar4 = (y + 1.0) * dVar8;
  dVar2 = (y + 1.0) * dVar2;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar4;
  auVar7 = vunpcklpd_avx(auVar9,auVar7);
  dVar8 = (1.0 - y) * dVar8;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar8;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar3;
  auVar6 = vunpcklpd_avx(auVar11,auVar6);
  auVar10._16_16_ = auVar7;
  auVar10._0_16_ = auVar6;
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar5._16_8_ = 0x8000000000000000;
  auVar5._24_8_ = 0x8000000000000000;
  auVar5 = vxorpd_avx512vl(auVar10,auVar5);
  *(undefined1 (*) [32])
   (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array =
       auVar5;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[4] =
       dVar3;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[5] =
       dVar8;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[6] =
       dVar4;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[7] =
       dVar2;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[8] =
       0.0;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[9] =
       0.0;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[10] =
       dVar1 * z * 0.5;
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::ShapeFunctionsDerivativeZ(ShapeVector& Nz, double x, double y, double z) {
    double c = GetDimensions().z();
    Nz(0) = 0.25 / c * (1 - x) * (1 - y) * (-1);
    Nz(1) = 0.25 / c * (1 + x) * (1 - y) * (-1);
    Nz(2) = 0.25 / c * (1 + x) * (1 + y) * (-1);
    Nz(3) = 0.25 / c * (1 - x) * (1 + y) * (-1);
    Nz(4) = 0.25 / c * (1 - x) * (1 - y) * (+1);
    Nz(5) = 0.25 / c * (1 + x) * (1 - y) * (+1);
    Nz(6) = 0.25 / c * (1 + x) * (1 + y) * (+1);
    Nz(7) = 0.25 / c * (1 - x) * (1 + y) * (+1);
    //
    Nz(8) = 0;
    Nz(9) = 0;
    Nz(10) = c * z * (1.0 / 2.0);
}